

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  long lVar2;
  KeyValue *it_1;
  KeyValue *pKVar3;
  size_t total_size;
  size_t local_28;
  anon_class_8_1_736c71da local_20;
  
  local_20.total_size = &local_28;
  local_28 = 0;
  pKVar3 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    for (lVar2 = (ulong)this->flat_size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
      MessageSetByteSize::anon_class_8_1_736c71da::operator()
                (&local_20,pKVar3->first,&pKVar3->second);
      pKVar3 = pKVar3 + 1;
    }
  }
  else {
    local_20.total_size = &local_28;
    for (p_Var1 = (_Rb_tree_node_base *)(pKVar3->second).descriptor;
        p_Var1 != (_Rb_tree_node_base *)&pKVar3->second;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      MessageSetByteSize::anon_class_8_1_736c71da::operator()
                (&local_20,p_Var1[1]._M_color,(Extension *)&p_Var1[1]._M_parent);
    }
  }
  return local_28;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.MessageSetItemByteSize(number);
  });
  return total_size;
}